

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

string * __thiscall pbrt::TriQuadMesh::ToString_abi_cxx11_(TriQuadMesh *this)

{
  string *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *in_stack_00000010;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_stack_00000020;
  char *in_stack_00000028;
  vector<int,_std::allocator<int>_> *in_stack_00000040;
  vector<int,_std::allocator<int>_> *in_stack_00000048;
  
  StringPrintf<std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>const&,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>const&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>const&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&>
            (in_stack_00000028,in_stack_00000020,
             (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)this,
             in_stack_00000010,in_stack_00000008,in_stack_00000040,in_stack_00000048);
  return in_RDI;
}

Assistant:

std::string TriQuadMesh::ToString() const {
    return StringPrintf("[ TriQuadMesh p: %s n: %s uv: %s faceIndices: %s triIndices: %s "
                        "quadIndices: %s ]",
                        p, n, uv, faceIndices, triIndices, quadIndices);
}